

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O2

size_t __thiscall avro::BinaryDecoder::skipArray(BinaryDecoder *this)

{
  size_t sVar1;
  
  while( true ) {
    sVar1 = doDecodeLong(this);
    if (-1 < (long)sVar1) break;
    sVar1 = doDecodeLong(this);
    StreamReader::skipBytes(&this->in_,sVar1);
  }
  return sVar1;
}

Assistant:

size_t BinaryDecoder::skipArray()
{
    for (; ;) {
        int64_t r = doDecodeLong();
        if (r < 0) {
            size_t n = static_cast<size_t>(doDecodeLong()); 
            in_.skipBytes(n);
        } else {
            return static_cast<size_t>(r);
        }
    }
}